

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_begin_multi_dim
          (basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
           *this,span<const_unsigned_long,_18446744073709551615UL> *shape,semantic_tag tag,
          ser_context *context,error_code *ec)

{
  size_t *psVar1;
  pointer psVar2;
  undefined7 in_register_00000011;
  uint64_t *puVar3;
  
  if ((int)CONCAT71(in_register_00000011,tag) == 0x10) {
    write_tag(this,0x410);
  }
  else {
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  }
  visit_begin_array(this,2,none,context,ec);
  if ((ec->_M_value == 0) &&
     (visit_begin_array(this,shape->size_,none,context,ec), ec->_M_value == 0)) {
    if (shape->size_ != 0) {
      puVar3 = shape->data_;
      do {
        write_uint64_value(this,*puVar3);
        psVar2 = (this->stack_).
                 super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->stack_).
            super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
            ._M_impl.super__Vector_impl_data._M_start != psVar2) {
          psVar1 = &psVar2[-1].index_;
          *psVar1 = *psVar1 + 1;
        }
        if (ec->_M_value != 0) {
          return true;
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != shape->data_ + shape->size_);
    }
    visit_end_array(this,context,ec);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_multi_dim(const jsoncons::span<const size_t>& shape,
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::multi_dim_column_major:
                write_tag(1040);
                break;
            default:
                write_tag(40);
                break;
        }
        visit_begin_array(2, semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        visit_begin_array(shape.size(), semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        for (auto it = shape.begin(); it != shape.end(); ++it)
        {
            visit_uint64(*it, semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        }
        visit_end_array(context, ec);
        JSONCONS_VISITOR_RETURN;
    }